

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O3

void __thiscall
MipsOpcodeFormatter::handleOpcodeParameters
          (MipsOpcodeFormatter *this,MipsOpcodeData *opData,MipsRegisterData *regData,
          MipsImmediateData *immData)

{
  byte *args;
  byte bVar1;
  byte *pbVar2;
  pointer pcVar3;
  MipsImmediateType type;
  byte *local_68;
  MipsOpcodeData *local_60;
  string local_58;
  MipsImmediateType local_34;
  
  pbVar2 = (byte *)(opData->opcode).encoding;
  bVar1 = *pbVar2;
  local_60 = opData;
  do {
    if (bVar1 == 0) {
      return;
    }
    args = pbVar2 + 1;
    local_68 = args;
    if (bVar1 < 100) {
      switch(bVar1) {
      case 0x53:
        pcVar3 = (regData->frs).name._name._M_dataplus._M_p;
        break;
      case 0x54:
        pcVar3 = (regData->frt).name._name._M_dataplus._M_p;
        break;
      case 0x55:
        goto switchD_00169e91_caseD_65;
      case 0x56:
        local_68 = pbVar2 + 2;
        bVar1 = pbVar2[1];
        if (bVar1 == 0x74) {
          pcVar3 = (regData->ps2vrt).name._name._M_dataplus._M_p;
        }
        else if (bVar1 == 0x73) {
          pcVar3 = (regData->ps2vrs).name._name._M_dataplus._M_p;
        }
        else {
          if (bVar1 != 100) goto switchD_00169ee3_caseD_57;
          pcVar3 = (regData->ps2vrd).name._name._M_dataplus._M_p;
        }
        break;
      case 0x57:
        goto switchD_00169ee3_caseD_57;
      default:
        if (bVar1 != 0x43) {
          if (bVar1 != 0x44) goto switchD_00169e91_caseD_65;
          pcVar3 = (regData->frd).name._name._M_dataplus._M_p;
          break;
        }
        goto switchD_00169ee3_caseD_57;
      }
      goto LAB_0016a07c;
    }
    switch(bVar1) {
    case 100:
      pcVar3 = (regData->grd).name._name._M_dataplus._M_p;
      goto LAB_0016a07c;
    default:
switchD_00169e91_caseD_65:
      std::__cxx11::string::push_back((char)this);
      local_68 = args;
      break;
    case 0x69:
      decodeImmediateSize((char **)&local_68,&local_34);
      handleImmediate(this,(immData->primary).type,(immData->primary).originalValue,
                      (local_60->opcode).flags);
      break;
    case 0x6a:
      handleImmediate(this,(immData->secondary).type,(immData->secondary).originalValue,
                      (local_60->opcode).flags);
      goto LAB_0016a013;
    case 0x6d:
    case 0x76:
      local_68 = pbVar2 + 2;
      bVar1 = pbVar2[1];
      if (bVar1 == 0x74) {
        pcVar3 = (regData->vrt).name._name._M_dataplus._M_p;
      }
      else if (bVar1 == 0x73) {
        pcVar3 = (regData->vrs).name._name._M_dataplus._M_p;
      }
      else {
        if (bVar1 != 100) break;
        pcVar3 = (regData->vrd).name._name._M_dataplus._M_p;
      }
      goto LAB_0016a07c;
    case 0x72:
      tinyformat::format<char>(&local_58,"r%d",(char *)args);
      std::__cxx11::string::_M_append((char *)this,(ulong)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
LAB_0016a013:
      local_68 = pbVar2 + 2;
      break;
    case 0x73:
      pcVar3 = (regData->grs).name._name._M_dataplus._M_p;
      goto LAB_0016a07c;
    case 0x74:
      pcVar3 = (regData->grt).name._name._M_dataplus._M_p;
LAB_0016a07c:
      pbVar2 = local_68;
      std::__cxx11::string::_M_append((char *)this,(ulong)pcVar3);
      local_68 = pbVar2;
      break;
    case 0x77:
      std::__cxx11::string::append((char *)this);
      local_68 = args;
    }
switchD_00169ee3_caseD_57:
    bVar1 = *local_68;
    pbVar2 = local_68;
  } while( true );
}

Assistant:

void MipsOpcodeFormatter::handleOpcodeParameters(const MipsOpcodeData& opData, const MipsRegisterData& regData,
	const MipsImmediateData& immData)
{
	const char* encoding = opData.opcode.encoding;

	MipsImmediateType type;
	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 'r':	// forced register
			buffer += tfm::format("r%d",*encoding);
			encoding += 1;
			break;
		case 's':	// register
			buffer += regData.grs.name.string();
			break;
		case 'd':	// register
			buffer += regData.grd.name.string();
			break;
		case 't':	// register
			buffer += regData.grt.name.string();
			break;
		case 'S':	// fpu register
			buffer += regData.frs.name.string();
			break;
		case 'D':	// fpu register
			buffer += regData.frd.name.string();
			break;
		case 'T':	// fpu register
			buffer += regData.frt.name.string();
			break;
		case 'v':	// psp vfpu reg
		case 'm':	// vfpu matrix register
			switch (*encoding++)
			{
			case 'd':
				buffer += regData.vrd.name.string();
				break;
			case 's':
				buffer += regData.vrs.name.string();
				break;
			case 't':
				buffer += regData.vrt.name.string();
				break;
			}
			break;
		case 'V':	// ps2 vector reg
			switch (*encoding++)
			{
			case 'd':
				buffer += regData.ps2vrd.name.string();
				break;
			case 's':
				buffer += regData.ps2vrs.name.string();
				break;
			case 't':
				buffer += regData.ps2vrt.name.string();
				break;
			}
			break;
		case 'i':	// primary immediate
			decodeImmediateSize(encoding,type);
			handleImmediate(immData.primary.type,immData.primary.originalValue,opData.opcode.flags);
			break;
		case 'j':	// secondary immediate
			handleImmediate(immData.secondary.type,immData.secondary.originalValue, opData.opcode.flags);
			encoding++;
			break;
		case 'C':	// vfpu condition
		case 'W':	// vfpu argument
			// TODO
			break;
		case 'w':	// 'wb' characters
			buffer += "wb";
			break;
		default:
			buffer += *(encoding-1);
			break;
		}
	}
}